

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::updateBounds(btSoftBody *this)

{
  btDbvtNode *v1;
  btBroadphaseProxy *pbVar1;
  btBroadphaseInterface *pbVar2;
  btVector3 *mins;
  undefined4 extraout_XMM0_Da;
  btVector3 bVar3;
  btVector3 mrg;
  btVector3 local_30;
  
  v1 = (this->m_ndbvt).m_root;
  if (v1 == (btDbvtNode *)0x0) {
    this->m_bounds[1].m_floats[0] = 0.0;
    this->m_bounds[1].m_floats[1] = 0.0;
    this->m_bounds[1].m_floats[2] = 0.0;
    this->m_bounds[1].m_floats[3] = 0.0;
    this->m_bounds[0].m_floats[0] = 0.0;
    this->m_bounds[0].m_floats[1] = 0.0;
    this->m_bounds[0].m_floats[2] = 0.0;
    this->m_bounds[0].m_floats[3] = 0.0;
  }
  else {
    (*((this->super_btCollisionObject).m_collisionShape)->_vptr_btCollisionShape[0xc])();
    local_30.m_floats[1] = (btScalar)extraout_XMM0_Da;
    local_30.m_floats[0] = (btScalar)extraout_XMM0_Da;
    local_30.m_floats[2] = (btScalar)extraout_XMM0_Da;
    local_30.m_floats[3] = 0.0;
    bVar3 = operator-((btVector3 *)v1,&local_30);
    *&this->m_bounds[0].m_floats = bVar3.m_floats;
    bVar3 = operator+(&(v1->volume).mx,&local_30);
    *&this->m_bounds[1].m_floats = bVar3.m_floats;
    pbVar1 = (this->super_btCollisionObject).m_broadphaseHandle;
    if (pbVar1 != (btBroadphaseProxy *)0x0) {
      pbVar2 = this->m_worldInfo->m_broadphase;
      (*pbVar2->_vptr_btBroadphaseInterface[4])
                (pbVar2,pbVar1,this->m_bounds,this->m_bounds + 1,this->m_worldInfo->m_dispatcher);
    }
  }
  return;
}

Assistant:

void					btSoftBody::updateBounds()
{
	/*if( m_acceleratedSoftBody )
	{
		// If we have an accelerated softbody we need to obtain the bounds correctly
		// For now (slightly hackily) just have a very large AABB
		// TODO: Write get bounds kernel
		// If that is updating in place, atomic collisions might be low (when the cloth isn't perfectly aligned to an axis) and we could
		// probably do a test and exchange reasonably efficiently.

		m_bounds[0] = btVector3(-1000, -1000, -1000);
		m_bounds[1] = btVector3(1000, 1000, 1000);

	} else {*/
		if(m_ndbvt.m_root)
		{
			const btVector3&	mins=m_ndbvt.m_root->volume.Mins();
			const btVector3&	maxs=m_ndbvt.m_root->volume.Maxs();
			const btScalar		csm=getCollisionShape()->getMargin();
			const btVector3		mrg=btVector3(	csm,
				csm,
				csm)*1; // ??? to investigate...
			m_bounds[0]=mins-mrg;
			m_bounds[1]=maxs+mrg;
			if(0!=getBroadphaseHandle())
			{					
				m_worldInfo->m_broadphase->setAabb(	getBroadphaseHandle(),
					m_bounds[0],
					m_bounds[1],
					m_worldInfo->m_dispatcher);
			}
		}
		else
		{
			m_bounds[0]=
				m_bounds[1]=btVector3(0,0,0);
		}		
	//}
}